

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_identity(lysp_yang_ctx *ctx,lysp_ident **identities)

{
  lysp_ext_instance **exts;
  lysp_ident *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  lyd_node **word_len_00;
  uint16_t *puVar7;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar8;
  void *parent;
  lysp_ext_instance **exts_00;
  uint16_t *puVar9;
  char **str_p;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff90;
  ly_stmt in_stack_ffffffffffffff94;
  char *local_68;
  lyd_node *local_60;
  uint16_t *local_58;
  lysp_qname **local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  lysp_ext_instance *local_38;
  
  plVar1 = *identities;
  if (plVar1 == (lysp_ident *)0x0) {
    plVar4 = (long *)malloc(0x40);
    if (plVar4 == (long *)0x0) goto LAB_0017a33f;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar5 * 0x38 + 0x40);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
LAB_0017a33f:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_identity");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *identities = (lysp_ident *)(plVar4 + 1);
  plVar4[lVar5 * 7 + -2] = 0;
  (plVar4 + lVar5 * 7 + -2)[1] = 0;
  plVar4[lVar5 * 7 + -4] = 0;
  (plVar4 + lVar5 * 7 + -4)[1] = 0;
  plVar4[lVar5 * 7 + -6] = 0;
  (plVar4 + lVar5 * 7 + -6)[1] = 0;
  plVar4[lVar5 * 7] = 0;
  exts_00 = &local_38;
  LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_68,(char **)exts_00,
                       (size_t *)&local_60);
  if (LVar3 == LY_SUCCESS) {
    str_p = (char **)(plVar4 + lVar5 * 7 + -6);
    if (local_38 == (lysp_ext_instance *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = local_68;
      if (local_60 == (lyd_node *)0x0) {
        pcVar6 = "";
      }
      LVar3 = lydict_insert(plVar8,pcVar6,(size_t)local_60,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert_zc(plVar8,local_68,str_p);
    }
    if (((LVar3 == LY_SUCCESS) &&
        (LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,(size_t *)&local_60),
        LVar3 == LY_SUCCESS)) &&
       (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_SEMICOLON)) {
      if (in_stack_ffffffffffffff94 == LY_STMT_SYNTAX_LEFT_BRACE) {
        word_len_00 = &local_60;
        LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,(size_t *)word_len_00)
        ;
        if ((LVar3 == LY_SUCCESS) &&
           (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
          local_40 = (uint16_t *)(plVar4 + lVar5 * 7);
          exts = (lysp_ext_instance **)(local_40 + -4);
          local_58 = local_40 + -0x10;
          local_48 = local_40 + -8;
          local_50 = (lysp_qname **)(local_40 + -0x14);
          puVar9 = local_40 + -0xc;
          do {
            if ((int)in_stack_ffffffffffffff94 < 0x130000) {
              if (in_stack_ffffffffffffff94 == LY_STMT_BASE) {
                if (*(long *)local_58 != 0) {
                  word_len_00 = (ctx->parsed_mods->field_2).dnodes;
                  if (*(byte *)&word_len_00[ctx->parsed_mods->count - 1][2].schema < 2) {
                    ly_vlog((ly_ctx *)**(undefined8 **)word_len_00[ctx->parsed_mods->count - 1],
                            (char *)0x0,LYVE_SYNTAX_YANG,
                            "Identity can be derived from multiple base identities only in YANG 1.1 modules"
                           );
                    goto LAB_0017a648;
                  }
                }
                LVar3 = parse_text_fields(ctx,(ly_stmt)local_58,(char ***)exts,(yang_arg)word_len_00
                                          ,exts_00);
              }
              else if (in_stack_ffffffffffffff94 == LY_STMT_DESCRIPTION) {
                parent = *(void **)puVar9;
                parent_stmt = LY_STMT_DESCRIPTION;
                puVar7 = puVar9;
LAB_0017a59a:
                exts_00 = (lysp_ext_instance **)0x2;
                LVar3 = parse_text_field(ctx,parent,parent_stmt,(uint32_t)puVar7,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,
                                         (lysp_ext_instance **)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90));
              }
              else {
                if (in_stack_ffffffffffffff94 != LY_STMT_EXTENSION_INSTANCE) {
LAB_0017a652:
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
                  goto LAB_0017a6d3;
                }
                exts_00 = (lysp_ext_instance **)0x120000;
                LVar3 = parse_ext(ctx,local_68,(size_t)local_60,str_p,LY_STMT_IDENTITY,0,exts);
              }
            }
            else if (in_stack_ffffffffffffff94 == LY_STMT_IF_FEATURE) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar8 = (ly_ctx *)**(undefined8 **)plVar2;
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar6 = "if-feature";
LAB_0017a6d3:
                ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"identity");
                goto LAB_0017a648;
              }
              LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_50,(yang_arg)exts,exts_00);
            }
            else {
              if (in_stack_ffffffffffffff94 == LY_STMT_REFERENCE) {
                parent = *(void **)local_48;
                parent_stmt = LY_STMT_REFERENCE;
                puVar7 = local_48;
                goto LAB_0017a59a;
              }
              if (in_stack_ffffffffffffff94 != LY_STMT_STATUS) goto LAB_0017a652;
              LVar3 = parse_status(ctx,local_40,exts);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            word_len_00 = &local_60;
            LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,
                                (size_t *)&local_60);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
          } while (in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_RIGHT_BRACE);
          if ((*exts == (lysp_ext_instance *)0x0) ||
             (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             LVar3 == LY_SUCCESS)) {
            LVar3 = LY_SUCCESS;
          }
        }
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
LAB_0017a648:
        LVar3 = LY_EVALID;
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_identity(struct lysp_yang_ctx *ctx, struct lysp_ident **identities)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_ident *ident;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *identities, ident, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, ident->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, ident->dsc, LY_STMT_DESCRIPTION, 0, &ident->dsc, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "identity");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &ident->iffeatures, Y_STR_ARG, &ident->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, ident->ref, LY_STMT_REFERENCE, 0, &ident->ref, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &ident->flags, &ident->exts));
            break;
        case LY_STMT_BASE:
            if (ident->bases && (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1)) {
                LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG,
                        "Identity can be derived from multiple base identities only in YANG 1.1 modules");
                return LY_EVALID;
            }
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &ident->bases, Y_PREF_IDENTIF_ARG, &ident->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, ident, LY_STMT_IDENTITY, 0, &ident->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "identity");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, ident->exts, ret, cleanup);
    }

cleanup:
    return ret;
}